

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpk_algorithm.c
# Opt level: O0

void fpk_a(void)

{
  kca_joint *joint;
  int local_100;
  int i;
  solver_state_a s;
  kca_kinematic_chain *kc;
  
  s.f_ext_tf = (ma_wrench *)&two_dof_robot_a;
  setup_simple_state_a(&two_dof_robot_a,&local_100);
  for (joint._4_4_ = 1; joint._4_4_ < local_100 + 1; joint._4_4_ = joint._4_4_ + 1) {
    kca_fpk((s.f_ext_tf)->point + (long)(joint._4_4_ + -1) * 0xc + 4,
            s._8_8_ + (long)(joint._4_4_ + -1) * 0x20);
    ga_pose_compose(s._8_8_ + (long)(joint._4_4_ + -1) * 0x20,
                    (s.f_ext_tf)->point + (long)(joint._4_4_ + -1) * 0xc,
                    s.x_jnt + (joint._4_4_ + -1));
    ga_pose_compose(s.x_jnt + (joint._4_4_ + -1),s.x_rel + (joint._4_4_ + -1),s.x_rel + joint._4_4_)
    ;
  }
  ga_pose_log(s.x_rel + local_100);
  return;
}

Assistant:

void fpk_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);

        // i^X_0 = i^X_{i-1} {i-1}^X_0
        ga_pose_compose(&s.x_rel[i - 1], &s.x_tot[i - 1], &s.x_tot[i]);
    }

    ga_pose_log(&s.x_tot[s.nbody]);
}